

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
::noshrink_reserve(table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *this,size_t n)

{
  value_type_pointer p;
  long lVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  arrays_type new_arrays_;
  undefined1 local_29;
  size_t local_28;
  size_t sStack_20;
  group_type_pointer local_18;
  value_type_pointer pbStack_10;
  
  if (n != 0) {
    fVar5 = ceilf((float)n / 0.875);
    uVar4 = (long)(fVar5 - 9.223372e+18) & (long)fVar5 >> 0x3f | (long)fVar5;
    uVar3 = uVar4 / 0xf;
    if (uVar3 == 0) {
      bVar2 = 0;
    }
    else {
      lVar1 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      bVar2 = (byte)lVar1 ^ 0x3f;
    }
    uVar3 = 0x1d;
    if (0x1d < uVar4) {
      uVar3 = (0xfL << (-bVar2 & 0x3f)) - 1;
    }
    uVar4 = (this->arrays).groups_size_mask * 0xf + 0xe;
    if ((this->arrays).elements_ == (value_type_pointer)0x0) {
      uVar4 = 0;
    }
    if (uVar4 < uVar3) {
      table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::new_(&local_28,&local_29);
      p = (this->arrays).elements_;
      if (p != (value_type_pointer)0x0) {
        operator_delete(p,(this->arrays).groups_size_mask * 0x100 + 0x100);
      }
      (this->arrays).groups_ = local_18;
      (this->arrays).elements_ = pbStack_10;
      (this->arrays).groups_size_index = local_28;
      (this->arrays).groups_size_mask = sStack_20;
      uVar3 = (this->arrays).groups_size_mask * 0xf + 0xe;
      if ((this->arrays).elements_ == (value_type_pointer)0x0) {
        uVar3 = 0;
      }
      uVar4 = (ulong)((float)uVar3 * 0.875);
      uVar4 = (long)((float)uVar3 * 0.875 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4;
      if (uVar3 < 0x1e) {
        uVar4 = uVar3;
      }
      (this->size_ctrl).ml = uVar4;
    }
  }
  return;
}

Assistant:

void noshrink_reserve(std::size_t n) {
        /* used only on assignment after element clearance */
        BOOST_ASSERT(empty());

        if (n) {
            n = std::size_t(std::ceil(float(n) / mlf));
            n = capacity_for(n);

            if (n > capacity()) {
                auto new_arrays_ = new_arrays(n);
                delete_arrays(arrays);
                arrays = new_arrays_;
                size_ctrl.ml = initial_max_load();
            }
        }
    }